

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::GenerateSwiftOutputFileMap
          (cmNinjaTargetGenerator *this,string *config,string *flags)

{
  cmLocalNinjaGenerator *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  mapped_type *pmVar4;
  Value *pVVar5;
  string *psVar6;
  allocator<char> local_3f9;
  string local_3f8 [32];
  undefined1 local_3d8 [8];
  cmGeneratedFileStream output;
  undefined1 local_148 [8];
  Value deps;
  cmAlphaNum local_118;
  string local_e8;
  cmAlphaNum local_c8;
  undefined1 local_98 [8];
  string mapFilePath;
  cmNinjaTargetGenerator *local_68;
  string local_60 [32];
  undefined1 local_40 [8];
  string targetSwiftDepsPath;
  string *flags_local;
  string *config_local;
  cmNinjaTargetGenerator *this_local;
  
  targetSwiftDepsPath.field_2._8_8_ = flags;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
           ::operator[](&this->Configs,config);
  bVar3 = Json::Value::empty(&pmVar4->SwiftOutputMap);
  if (!bVar3) {
    local_68 = this;
    std::__cxx11::string::string(local_60,(string *)config);
    GenerateSwiftOutputFileMap(std::__cxx11::string_const&,std::__cxx11::string&)::$_0::
    operator()[abi_cxx11_((string *)local_40,(__0 *)&local_68);
    GenerateSwiftOutputFileMap(std::__cxx11::string_const&,std::__cxx11::string&)::$_0::~__0
              ((__0 *)&local_68);
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
              (&local_e8,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    cmAlphaNum::cmAlphaNum(&local_c8,&local_e8);
    cmAlphaNum::cmAlphaNum(&local_118,'/');
    deps.limit_._7_1_ = 0x2f;
    cmStrCat<std::__cxx11::string,char,char[21]>
              ((string *)local_98,&local_c8,&local_118,config,(char *)((long)&deps.limit_ + 7),
               (char (*) [21])"output-file-map.json");
    std::__cxx11::string::~string((string *)&local_e8);
    Json::Value::Value((Value *)local_148,objectValue);
    Json::Value::Value((Value *)&output.field_0x260,(String *)local_40);
    pVVar5 = Json::Value::operator[]((Value *)local_148,"swift-dependencies");
    Json::Value::operator=(pVVar5,(Value *)&output.field_0x260);
    Json::Value::~Value((Value *)&output.field_0x260);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
             ::operator[](&this->Configs,config);
    pVVar5 = Json::Value::operator[](&pmVar4->SwiftOutputMap,"");
    Json::Value::operator=(pVVar5,(Value *)local_148);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_3d8,(string *)local_98,false,None);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
             ::operator[](&this->Configs,config);
    Json::operator<<((OStream *)local_3d8,&pmVar4->SwiftOutputMap);
    uVar2 = targetSwiftDepsPath.field_2._8_8_;
    pcVar1 = this->LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3f8,"-output-file-map",&local_3f9);
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar1,uVar2,local_3f8);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    uVar2 = targetSwiftDepsPath.field_2._8_8_;
    pcVar1 = this->LocalGenerator;
    psVar6 = ConvertToNinjaPath(this,(string *)local_98);
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[8])
              (pcVar1,uVar2,psVar6);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_3d8);
    Json::Value::~Value((Value *)local_148);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::GenerateSwiftOutputFileMap(
  const std::string& config, std::string& flags)
{
  if (this->Configs[config].SwiftOutputMap.empty()) {
    return;
  }

  std::string const targetSwiftDepsPath = [this, config]() -> std::string {
    cmGeneratorTarget const* target = this->GeneratorTarget;
    if (cmValue name = target->GetProperty("Swift_DEPENDENCIES_FILE")) {
      return *name;
    }
    return this->ConvertToNinjaPath(cmStrCat(target->GetSupportDirectory(),
                                             '/', config, '/',
                                             target->GetName(), ".swiftdeps"));
  }();

  std::string mapFilePath =
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(), '/', config, '/',
             "output-file-map.json");

  // build the global target dependencies
  // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
  Json::Value deps(Json::objectValue);
  deps["swift-dependencies"] = targetSwiftDepsPath;
  this->Configs[config].SwiftOutputMap[""] = deps;

  cmGeneratedFileStream output(mapFilePath);
  output << this->Configs[config].SwiftOutputMap;

  // Add flag
  this->LocalGenerator->AppendFlags(flags, "-output-file-map");
  this->LocalGenerator->AppendFlagEscape(flags,
                                         ConvertToNinjaPath(mapFilePath));
}